

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferingScanTarget.cpp
# Opt level: O3

void __thiscall
Outputs::Display::BufferingScanTarget::perform
          (BufferingScanTarget *this,function<void_()> *function)

{
  __atomic_flag_data_type _Var1;
  
  do {
    LOCK();
    _Var1 = (this->is_updating_).super___atomic_flag_base._M_i;
    (this->is_updating_).super___atomic_flag_base._M_i = true;
    UNLOCK();
  } while (_Var1 != false);
  if ((function->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*function->_M_invoker)((_Any_data *)function);
    (this->is_updating_).super___atomic_flag_base._M_i = false;
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void BufferingScanTarget::perform(const std::function<void(void)> &function) {
	while(is_updating_.test_and_set(std::memory_order_acquire));
	function();
	is_updating_.clear(std::memory_order_release);
}